

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::_readFileReal
          (SoPlexBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *intVars)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  SoPlexBase<double> *in_RDI;
  undefined8 in_R8;
  bool success;
  bool in_stack_0000007f;
  int in_stack_00000080;
  IntParam in_stack_00000084;
  SoPlexBase<double> *in_stack_00000088;
  SPxLPBase<double> *this_00;
  undefined1 time;
  Real local_38;
  byte local_29;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Statistics::clearAllData((Statistics *)in_RDI);
  clearBasis(in_RDI);
  _invalidateSolution(in_RDI);
  in_RDI->_status = UNKNOWN;
  (*in_RDI->_statistics->readingTime->_vptr_Timer[3])();
  iVar1 = (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1f])
                    (in_RDI->_realLP,local_10,local_18,local_20,local_28);
  local_29 = (byte)iVar1 & 1;
  (*in_RDI->_statistics->readingTime->_vptr_Timer[4])();
  if ((local_29 & 1) == 0) {
    clearLPReal(in_RDI);
  }
  else {
    SPxLPBase<double>::spxSense(in_RDI->_realLP);
    setIntParam(in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_0000007f);
    this_00 = in_RDI->_realLP;
    local_38 = realParam(in_RDI,OBJ_OFFSET);
    SPxLPBase<double>::changeObjOffset<double>(this_00,&local_38);
    time = (undefined1)((ulong)this_00 >> 0x38);
    iVar1 = intParam(in_RDI,SYNCMODE);
    if (iVar1 == 1) {
      _syncLPRational(in_RDI,(bool)time);
    }
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool SoPlexBase<R>::_readFileReal(const char* filename, NameSet* rowNames, NameSet* colNames,
                                  DIdxSet* intVars)
{
   assert(_realLP != nullptr);

   // clear statistics
   _statistics->clearAllData();

   // update status
   clearBasis();
   _invalidateSolution();
   _status = SPxSolverBase<R>::UNKNOWN;

   // start timing
   _statistics->readingTime->start();

   // read
   bool success = _realLP->readFile(filename, rowNames, colNames, intVars);

   // stop timing
   _statistics->readingTime->stop();

   if(success)
   {
      setIntParam(SoPlexBase<R>::OBJSENSE,
                  (_realLP->spxSense() == SPxLPBase<R>::MAXIMIZE ? SoPlexBase<R>::OBJSENSE_MAXIMIZE :
                   SoPlexBase<R>::OBJSENSE_MINIMIZE), true);
      _realLP->changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));

      // if sync mode is auto, we have to copy the (rounded) R LP to the rational LP; this is counted to sync time
      // and not to reading time
      if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
         _syncLPRational();
   }
   else
      clearLPReal();

   return success;
}